

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall Engine::clearPropState(Engine *this)

{
  uint uVar1;
  IntVar **ppIVar2;
  vec<Propagator_*> *pvVar3;
  Propagator **ppPVar4;
  vec<IntVar_*> *in_RDI;
  uint j;
  int i_1;
  uint i;
  bool dealloc;
  uint local_14;
  uint local_10;
  uint local_c;
  
  local_c = 0;
  while( true ) {
    uVar1 = vec<IntVar_*>::size((vec<IntVar_*> *)&in_RDI[9].data);
    if (uVar1 <= local_c) break;
    ppIVar2 = vec<IntVar_*>::operator[]((vec<IntVar_*> *)&in_RDI[9].data,local_c);
    IntVar::clearPropState(*ppIVar2);
    local_c = local_c + 1;
  }
  dealloc = SUB41(local_c >> 0x18,0);
  vec<IntVar_*>::clear(in_RDI,dealloc);
  for (local_10 = 0; (int)local_10 < 6; local_10 = local_10 + 1) {
    local_14 = 0;
    while( true ) {
      pvVar3 = vec<vec<Propagator_*>_>::operator[]
                         ((vec<vec<Propagator_*>_> *)&in_RDI[10].data,local_10);
      uVar1 = vec<Propagator_*>::size(pvVar3);
      if (uVar1 <= local_14) break;
      pvVar3 = vec<vec<Propagator_*>_>::operator[]
                         ((vec<vec<Propagator_*>_> *)&in_RDI[10].data,local_10);
      ppPVar4 = vec<Propagator_*>::operator[](pvVar3,local_14);
      (*(*ppPVar4)->_vptr_Propagator[4])();
      local_14 = local_14 + 1;
    }
    vec<vec<Propagator_*>_>::operator[]((vec<vec<Propagator_*>_> *)&in_RDI[10].data,local_10);
    vec<Propagator_*>::clear((vec<Propagator_*> *)in_RDI,dealloc);
  }
  return;
}

Assistant:

void Engine::clearPropState() {
	for (unsigned int i = 0; i < v_queue.size(); i++) {
		v_queue[i]->clearPropState();
	}
	v_queue.clear();

	for (int i = 0; i < num_queues; i++) {
		for (unsigned int j = 0; j < p_queue[i].size(); j++) {
			p_queue[i][j]->clearPropState();
		}
		p_queue[i].clear();
	}
}